

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

TreeOrError *
slang::syntax::SyntaxTree::fromFiles
          (TreeOrError *__return_storage_ptr__,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          paths)

{
  Bag *in_R9;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> paths_00
  ;
  pthread_rwlock_t local_58;
  
  paths_00._M_ptr = paths._M_extent._M_extent_value;
  getDefaultSourceManager();
  local_58._32_8_ = 0;
  local_58.__data.__pad2 = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&local_58.__data);
  paths_00._M_extent._M_extent_value = (size_t)&getDefaultSourceManager::instance;
  fromFiles(__return_storage_ptr__,(SyntaxTree *)paths._M_ptr,paths_00,
            (SourceManager *)&local_58.__data,in_R9);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&local_58.__data);
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths) {
    return fromFiles(paths, getDefaultSourceManager());
}